

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-attack.c
# Opt level: O3

_Bool monster_can_cast(monster_conflict *mon,_Bool innate)

{
  int iVar1;
  int iVar2;
  loc grid2;
  loc grid;
  loc grid2_00;
  _Bool _Var3;
  uint32_t uVar4;
  wchar_t wVar5;
  loc *gp;
  ulong uVar6;
  bool bVar7;
  loc tgrid;
  wchar_t tdist;
  loc local_38;
  uint local_2c;
  
  iVar1 = *(int *)(mon->race->flags + (ulong)!innate * 4 + -0xc);
  monster_get_target_dist_grid(mon,(int *)&local_2c,&local_38);
  _Var3 = flag_has_dbg(mon->mflag,2,3,"mon->mflag","MFLAG_NICE");
  if (iVar1 != 0 && !_Var3) {
    iVar2 = iVar1 / 2;
    if (player->timed[0x30] == 0) {
      iVar2 = iVar1;
    }
    bVar7 = local_2c == mon->best_range;
    uVar4 = Rand_div(100);
    if ((((int)uVar4 < iVar2 << bVar7) && ((int)local_2c <= (int)(uint)z_info->max_range)) &&
       (grid2.y = local_38.y, grid2.x = local_38.x,
       _Var3 = projectable((chunk *)cave,mon->grid,grid2,L'\x2000'), _Var3)) {
      if ((local_38.x == (player->grid).x) && (local_38.y == (player->grid).y)) {
        return true;
      }
      _Var3 = square_isview(cave,mon->grid);
      if (_Var3) {
        return true;
      }
      grid.y = local_38.y;
      grid.x = local_38.x;
      _Var3 = square_isview(cave,grid);
      if (_Var3) {
        return true;
      }
      gp = (loc *)mem_alloc((ulong)z_info->max_range << 3);
      grid2_00.y = local_38.y;
      grid2_00.x = local_38.x;
      wVar5 = project_path((chunk *)cave,gp,(uint)z_info->max_range,mon->grid,grid2_00,L'\x2000');
      if (L'\0' < wVar5) {
        uVar6 = 0;
        do {
          _Var3 = square_isview(cave,gp[uVar6]);
          if (_Var3) {
            mem_free(gp);
            return true;
          }
          uVar6 = uVar6 + 1;
        } while ((uint)wVar5 != uVar6);
      }
      mem_free(gp);
    }
  }
  return false;
}

Assistant:

static bool monster_can_cast(struct monster *mon, bool innate)
{
	int chance = innate ? mon->race->freq_innate : mon->race->freq_spell;
	int tdist;
	struct loc tgrid;

	monster_get_target_dist_grid(mon, &tdist, &tgrid);

	/* Cannot cast spells when nice */
	if (mflag_has(mon->mflag, MFLAG_NICE)) return false;

	/* Not allowed to cast spells */
	if (!chance) return false;

	/* Taunted monsters are likely just to attack */
	if (player->timed[TMD_TAUNT]) {
		chance /= 2;
	}

	/* Monsters at their preferred range are more likely to cast */
	if (tdist == mon->best_range) {
		chance *= 2;
	}

	/* Only do spells occasionally */
	if (randint0(100) >= chance) return false;

	/* Check range */
	if (tdist > z_info->max_range) return false;

	/* Check path */
	if (!projectable(cave, mon->grid, tgrid, PROJECT_SHORT))
		return false;

	/* If the target isn't the player, only cast if the player can witness */
	if ((tgrid.x != player->grid.x || tgrid.y != player->grid.y) &&
		!square_isview(cave, mon->grid) &&
		!square_isview(cave, tgrid)) {
		struct loc *path = mem_alloc(z_info->max_range * sizeof(*path));
		int npath, ipath;

		npath = project_path(cave, path, z_info->max_range, mon->grid,
			tgrid, PROJECT_SHORT);
		ipath = 0;
		while (1) {
			if (ipath >= npath) {
				/* No point on path visible.  Don't cast. */
				mem_free(path);
				return false;
			}
			if (square_isview(cave, path[ipath])) {
				break;
			}
			++ipath;
		}
		mem_free(path);
	}

	return true;
}